

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fshook.c
# Opt level: O2

int al_for_each_fs_entry
              (ALLEGRO_FS_ENTRY *dir,_func_int_ALLEGRO_FS_ENTRY_ptr_void_ptr *callback,void *extra)

{
  _Bool _Var1;
  uint uVar2;
  uint32_t uVar3;
  undefined7 extraout_var;
  ALLEGRO_FS_ENTRY *dir_00;
  ulong uVar5;
  ulong uVar4;
  
  if (dir != (ALLEGRO_FS_ENTRY *)0x0) {
    _Var1 = (*dir->vtable->fs_open_directory)(dir);
    uVar4 = CONCAT71(extraout_var,_Var1);
    if (_Var1) {
      do {
        uVar5 = uVar4 & 0xffffffff;
        while( true ) {
          dir_00 = (*dir->vtable->fs_read_directory)(dir);
          if (dir_00 == (ALLEGRO_FS_ENTRY *)0x0) {
            return 0;
          }
          uVar2 = (*callback)(dir_00,extra);
          if (uVar2 != 0) goto LAB_00159f20;
          uVar3 = (*dir_00->vtable->fs_entry_mode)(dir_00);
          if ((uVar3 & 0x20) != 0) break;
          (*dir_00->vtable->fs_destroy_entry)(dir_00);
        }
        uVar2 = al_for_each_fs_entry(dir_00,callback,extra);
LAB_00159f20:
        (*dir_00->vtable->fs_destroy_entry)(dir_00);
        uVar4 = (ulong)uVar2;
        if ((uVar2 != 0xffffffff) && (uVar2 != 2)) {
          uVar4 = uVar5;
        }
        if (uVar2 == 0xffffffff) {
          return (int)uVar4;
        }
        if (uVar2 == 2) {
          return (int)uVar4;
        }
      } while( true );
    }
  }
  al_set_errno(2);
  return -1;
}

Assistant:

int al_for_each_fs_entry(ALLEGRO_FS_ENTRY *dir,
                         int (*callback)(ALLEGRO_FS_ENTRY *dir, void *extra),
                         void *extra)
{
   ALLEGRO_FS_ENTRY *entry;

   if (!dir || !al_open_directory(dir)) {
      al_set_errno(ENOENT);
      return ALLEGRO_FOR_EACH_FS_ENTRY_ERROR;
   }
   
   for (entry = al_read_directory(dir); entry; entry = al_read_directory(dir)) {
      /* Call the callback first. */
      int result = callback(entry, extra);
      
      /* Recurse if requested and needed. Only OK allows recursion. */
      if (result == ALLEGRO_FOR_EACH_FS_ENTRY_OK) {
         if (al_get_fs_entry_mode(entry) & ALLEGRO_FILEMODE_ISDIR) {
            result = al_for_each_fs_entry(entry, callback, extra);
         }
      }

      al_destroy_fs_entry(entry);
      
      if ((result == ALLEGRO_FOR_EACH_FS_ENTRY_STOP) ||
         (result == ALLEGRO_FOR_EACH_FS_ENTRY_ERROR)) {
         return result;
      }
   }
   
   return ALLEGRO_FOR_EACH_FS_ENTRY_OK;
}